

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_example1.c
# Opt level: O2

int main(void)

{
  uint uVar1;
  uint *puVar2;
  long lVar3;
  _Bool _Var4;
  uint uVar5;
  roaring_bitmap_t *r;
  uint64_t uVar6;
  size_t sVar7;
  size_t sVar8;
  roaring_bitmap_t *prVar9;
  roaring_bitmap_t *prVar10;
  uint32_t *puVar11;
  roaring_bitmap_t *prVar12;
  roaring_bitmap_t *r2;
  roaring_uint32_iterator_t *prVar13;
  ulong uVar14;
  uint32_t i;
  uint32_t uVar15;
  char *pcVar16;
  uint32_t counter;
  roaring_bitmap_t *local_4a8;
  roaring_bitmap_t *local_4a0;
  char *reason_failure;
  char *reason;
  uint32_t somevalues [3];
  roaring_bitmap_t *allmybitmaps [3];
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  uint32_t buffer [256];
  
  puVar2 = (uint *)cpuid_Version_info(1);
  uVar14 = (ulong)puVar2[2];
  uVar5 = *puVar2 >> 4;
  uVar1 = uVar5 - 0x2065;
  if (uVar1 < 0xb) {
    uVar14 = 0x481;
    if ((0x481U >> (uVar1 & 0x1f) & 1) != 0) {
      pcVar16 = "Westmere";
      goto LAB_001026a6;
    }
    uVar14 = 0x120;
    if ((0x120U >> (uVar1 & 0x1f) & 1) != 0) {
      pcVar16 = "SandyBridge";
      goto LAB_001026a6;
    }
    if (uVar1 != 9) goto LAB_001023cb;
switchD_00102586_caseD_106a:
    pcVar16 = "Nehalem";
LAB_001026a6:
    printf("x64 processor:  %s\t",pcVar16,uVar14);
    printf(" compiler version: %s\t",
           "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
          );
    putchar(10);
    lVar3 = cpuid(0x80000006);
    if ((char)*(undefined4 *)(lVar3 + 0xc) != '@') {
      lVar3 = cpuid(0x80000006);
      printf("cache line: %d bytes\n",(ulong)(byte)*(uint *)(lVar3 + 0xc),
             (ulong)*(uint *)(lVar3 + 8),(ulong)*(uint *)(lVar3 + 0xc));
    }
    r = roaring_bitmap_create();
    for (uVar15 = 100; uVar15 != 1000; uVar15 = uVar15 + 1) {
      roaring_bitmap_add(r,uVar15);
    }
    _Var4 = roaring_bitmap_contains(r,500);
    _assert_true((ulong)_Var4,"roaring_bitmap_contains(r1, 500)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/c_example1.c"
                 ,0x16);
    uVar6 = roaring_bitmap_get_cardinality(r);
    printf("Cardinality = %d \n",uVar6 & 0xffffffff);
    sVar7 = roaring_bitmap_portable_size_in_bytes(r);
    roaring_bitmap_run_optimize(r);
    sVar8 = roaring_bitmap_portable_size_in_bytes(r);
    printf("size before run optimize %d bytes, and after %d bytes\n",sVar7 & 0xffffffff,
           sVar8 & 0xffffffff);
    local_448 = 0x600000005;
    local_458 = 0x100000000;
    uStack_450 = 0x300000002;
    prVar9 = roaring_bitmap_of_ptr(5,(uint32_t *)((long)&local_458 + 4));
    roaring_bitmap_printf(prVar9);
    somevalues[0] = 2;
    somevalues[1] = 3;
    somevalues[2] = 4;
    prVar10 = roaring_bitmap_of_ptr(3,somevalues);
    uVar6 = roaring_bitmap_get_cardinality(r);
    puVar11 = (uint32_t *)malloc(uVar6 * 4);
    _assert_true((ulong)(puVar11 != (uint32_t *)0x0),"arr1 != NULL",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/c_example1.c"
                 ,0x2d);
    roaring_bitmap_to_uint32_array(r,puVar11);
    prVar12 = roaring_bitmap_of_ptr(uVar6,puVar11);
    free(puVar11);
    _Var4 = roaring_bitmap_equals(r,prVar12);
    _assert_true((ulong)_Var4,"roaring_bitmap_equals(r1, r1f)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/c_example1.c"
                 ,0x31);
    roaring_bitmap_free(prVar12);
    puVar11 = (uint32_t *)malloc(4000);
    _assert_true((ulong)(puVar11 != (uint32_t *)0x0),"arr3 != NULL",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/c_example1.c"
                 ,0x38);
    roaring_bitmap_range_uint32_array(r,100,1000,puVar11);
    free(puVar11);
    prVar12 = roaring_bitmap_copy(prVar10);
    _Var4 = roaring_bitmap_equals(prVar10,prVar12);
    _assert_true((ulong)_Var4,"roaring_bitmap_equals(r3, z)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/c_example1.c"
                 ,0x3e);
    roaring_bitmap_free(prVar12);
    prVar12 = roaring_bitmap_or(r,prVar9);
    roaring_bitmap_or_inplace(prVar12,prVar10);
    local_4a8 = prVar10;
    allmybitmaps[0] = r;
    allmybitmaps[1] = prVar9;
    allmybitmaps[2] = prVar10;
    prVar10 = roaring_bitmap_or_many(3,allmybitmaps);
    _Var4 = roaring_bitmap_equals(prVar12,prVar10);
    _assert_true((ulong)_Var4,"roaring_bitmap_equals(r1_2_3, bigunion)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/c_example1.c"
                 ,0x49);
    r2 = roaring_bitmap_or_many_heap(3,allmybitmaps);
    _Var4 = roaring_bitmap_equals(prVar12,r2);
    _assert_true((ulong)_Var4,"roaring_bitmap_equals(r1_2_3, bigunionheap)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/c_example1.c"
                 ,0x4d);
    roaring_bitmap_free(prVar12);
    roaring_bitmap_free(prVar10);
    roaring_bitmap_free(r2);
    local_4a0 = prVar9;
    prVar9 = roaring_bitmap_and(r,prVar9);
    roaring_bitmap_free(prVar9);
    sVar7 = roaring_bitmap_portable_size_in_bytes(r);
    uVar14 = sVar7 & 0xffffffff;
    pcVar16 = (char *)malloc(uVar14);
    roaring_bitmap_portable_serialize(r,pcVar16);
    prVar9 = roaring_bitmap_portable_deserialize_safe(pcVar16,uVar14);
    if (prVar9 != (roaring_bitmap_t *)0x0) {
      reason = (char *)0x0;
      _Var4 = roaring_bitmap_internal_validate(prVar9,&reason);
      if (_Var4) {
        _Var4 = roaring_bitmap_equals(r,prVar9);
        _assert_true((ulong)_Var4,"roaring_bitmap_equals(r1, t)",
                     "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/c_example1.c"
                     ,100);
        roaring_bitmap_free(prVar9);
        sVar7 = roaring_bitmap_portable_deserialize_size(pcVar16,uVar14);
        printf("\nsizeofbitmap = %zu \n",sVar7);
        _assert_true((ulong)(sVar7 == uVar14),"sizeofbitmap == expectedsize",
                     "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/c_example1.c"
                     ,0x6d);
        prVar9 = roaring_bitmap_portable_deserialize_safe(pcVar16,uVar14);
        if (prVar9 == (roaring_bitmap_t *)0x0) {
          puts("Problem during deserialization.");
        }
        else {
          reason_failure = (char *)0x0;
          _Var4 = roaring_bitmap_internal_validate(prVar9,&reason_failure);
          if (_Var4) {
            _Var4 = roaring_bitmap_equals(r,prVar9);
            _assert_true((ulong)_Var4,"roaring_bitmap_equals(r1, t)",
                         "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/c_example1.c"
                         ,0x7c);
            roaring_bitmap_free(prVar9);
            free(pcVar16);
            counter = 0;
            roaring_iterate(r,roaring_iterator_sumall,&counter);
            counter = 0;
            prVar13 = roaring_iterator_create(r);
            while (prVar13->has_value == true) {
              counter = counter + 1;
              roaring_uint32_iterator_advance(prVar13);
            }
            roaring_uint32_iterator_free(prVar13);
            prVar13 = roaring_iterator_create(r);
            do {
              uVar15 = roaring_uint32_iterator_read(prVar13,buffer,0x100);
              for (uVar14 = 0; uVar15 != uVar14; uVar14 = uVar14 + 1) {
                counter = counter + buffer[uVar14];
              }
            } while (0xff < uVar15);
            roaring_uint32_iterator_free(prVar13);
            roaring_bitmap_free(r);
            roaring_bitmap_free(local_4a0);
            roaring_bitmap_free(local_4a8);
            puts("Success.");
            return 0;
          }
          printf("safely deserialized invalid bitmap: %s\n",reason_failure);
        }
      }
    }
    return 1;
  }
LAB_001023cb:
  switch(uVar5) {
  case 0x1066:
switchD_00102586_caseD_1066:
    pcVar16 = "Merom";
    goto LAB_001026a6;
  case 0x1067:
  case 0x106d:
    pcVar16 = "Penryn";
    goto LAB_001026a6;
  case 0x1068:
  case 0x1069:
  case 0x106b:
  case 0x106c:
switchD_00102586_caseD_1068:
    pcVar16 = "unknown";
    goto LAB_001026a6;
  case 0x106a:
  case 0x106e:
    goto switchD_00102586_caseD_106a;
  default:
    if (uVar5 - 99 < 2) {
      pcVar16 = "Prescott";
      goto LAB_001026a6;
    }
    if (uVar5 - 0x806c < 2) {
      pcVar16 = "TigerLake";
      goto LAB_001026a6;
    }
    if (uVar5 - 0xa065 < 2) {
      pcVar16 = "Cometlake";
      goto LAB_001026a6;
    }
    if (uVar5 == 0x66) {
      pcVar16 = "Presler";
      goto LAB_001026a6;
    }
    if (uVar5 == 0x6d) {
      pcVar16 = "Dothan";
      goto LAB_001026a6;
    }
    if (uVar5 == 0x6f) goto switchD_00102586_caseD_1066;
    if (uVar5 == 0x16c) {
      pcVar16 = "Pineview";
      goto LAB_001026a6;
    }
    if (uVar5 == 0x266) {
      pcVar16 = "Lincroft";
      goto LAB_001026a6;
    }
    if (uVar5 == 0x366) {
      pcVar16 = "Cedarview";
      goto LAB_001026a6;
    }
    if (uVar5 == 0x306a) {
      pcVar16 = "IvyBridge";
      goto LAB_001026a6;
    }
    if (uVar5 == 0x306c) {
      pcVar16 = "Haswell";
      goto LAB_001026a6;
    }
    if (uVar5 == 0x306d) {
      pcVar16 = "Broadwell";
      goto LAB_001026a6;
    }
    if (uVar5 == 0x30f1) goto LAB_00102594;
    if (uVar5 == 0x60f10) {
      pcVar16 = "Zen4";
      goto LAB_001026a6;
    }
    if (uVar5 == 0x506c) {
LAB_001025f4:
      pcVar16 = "Goldmont";
      goto LAB_001026a6;
    }
    if (uVar5 == 0x506e) {
      pcVar16 = "Skylake";
      goto LAB_001026a6;
    }
    if (uVar5 == 0x606a) {
LAB_00102600:
      pcVar16 = "Icelake";
    }
    else {
      if ((uVar5 != 0x60f0) && (uVar5 != 0x60f8)) {
        if (uVar5 == 0x706a) goto LAB_001025f4;
        if (uVar5 == 0x706e) goto LAB_00102600;
        if (uVar5 != 0x70f1) {
          if (uVar5 != 0x806e) {
            if ((uVar5 == 0x9067) || (uVar5 == 0x906a)) {
              pcVar16 = "Alderlake";
              goto LAB_001026a6;
            }
            if (uVar5 != 0x906e) {
              if (uVar5 != 0x90f0) {
                if (uVar5 == 0xa067) {
                  pcVar16 = "Rocketlake";
                  goto LAB_001026a6;
                }
                if (uVar5 == 0xb067) {
                  pcVar16 = "Raptorlake";
                  goto LAB_001026a6;
                }
                if (uVar5 != 0x20f10) {
                  if (uVar5 == 0x40f40) {
                    pcVar16 = "Zen3+";
                    goto LAB_001026a6;
                  }
                  if (uVar5 != 0x50f00) {
                    if (uVar5 == 0x406c) {
                      pcVar16 = "CherryTrail";
                      goto LAB_001026a6;
                    }
                    goto switchD_00102586_caseD_1068;
                  }
                }
                pcVar16 = "Zen3";
                goto LAB_001026a6;
              }
              goto LAB_00102594;
            }
          }
          pcVar16 = "Kabylake";
          goto LAB_001026a6;
        }
      }
LAB_00102594:
      pcVar16 = "Zen2";
    }
    goto LAB_001026a6;
  }
}

Assistant:

int main() {
    tellmeall();
    // create a new empty bitmap
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    // then we can add values
    for (uint32_t i = 100; i < 1000; i++) roaring_bitmap_add(r1, i);
    // check whether a value is contained
    assert_true(roaring_bitmap_contains(r1, 500));
    // compute how many bits there are:
    uint32_t cardinality = roaring_bitmap_get_cardinality(r1);
    printf("Cardinality = %d \n", cardinality);

    // if your bitmaps have long runs, you can compress them by calling
    // run_optimize
    uint32_t expectedsizebasic = roaring_bitmap_portable_size_in_bytes(r1);
    roaring_bitmap_run_optimize(r1);
    uint32_t expectedsizerun = roaring_bitmap_portable_size_in_bytes(r1);
    printf("size before run optimize %d bytes, and after %d bytes\n",
           expectedsizebasic, expectedsizerun);
    // create a new bitmap containing the values {1,2,3,5,6}
    roaring_bitmap_t *r2 = roaring_bitmap_from(1, 2, 3, 5, 6);
    roaring_bitmap_printf(r2);  // print it

    // we can also create a bitmap from a pointer to 32-bit integers
    uint32_t somevalues[] = {2, 3, 4};
    roaring_bitmap_t *r3 = roaring_bitmap_of_ptr(3, somevalues);

    // we can also go in reverse and go from arrays to bitmaps
    uint64_t card1 = roaring_bitmap_get_cardinality(r1);
    uint32_t *arr1 = (uint32_t *)malloc(card1 * sizeof(uint32_t));
    assert_true(arr1 != NULL);
    roaring_bitmap_to_uint32_array(r1, arr1);
    roaring_bitmap_t *r1f = roaring_bitmap_of_ptr(card1, arr1);
    free(arr1);
    assert_true(roaring_bitmap_equals(r1, r1f));  // what we recover is equal
    roaring_bitmap_free(r1f);

    // we can go from arrays to bitmaps from "offset" by "limit"
    size_t offset = 100;
    size_t limit = 1000;
    uint32_t *arr3 = (uint32_t *)malloc(limit * sizeof(uint32_t));
    assert_true(arr3 != NULL);
    roaring_bitmap_range_uint32_array(r1, offset, limit, arr3);
    free(arr3);

    // we can copy and compare bitmaps
    roaring_bitmap_t *z = roaring_bitmap_copy(r3);
    assert_true(roaring_bitmap_equals(r3, z));  // what we recover is equal
    roaring_bitmap_free(z);

    // we can compute union two-by-two
    roaring_bitmap_t *r1_2_3 = roaring_bitmap_or(r1, r2);
    roaring_bitmap_or_inplace(r1_2_3, r3);

    // we can compute a big union
    const roaring_bitmap_t *allmybitmaps[] = {r1, r2, r3};
    roaring_bitmap_t *bigunion = roaring_bitmap_or_many(3, allmybitmaps);
    assert_true(
        roaring_bitmap_equals(r1_2_3, bigunion));  // what we recover is equal
    // can also do the big union with a heap
    roaring_bitmap_t *bigunionheap =
        roaring_bitmap_or_many_heap(3, allmybitmaps);
    assert_true(roaring_bitmap_equals(r1_2_3, bigunionheap));

    roaring_bitmap_free(r1_2_3);
    roaring_bitmap_free(bigunion);
    roaring_bitmap_free(bigunionheap);

    // we can compute intersection two-by-two
    roaring_bitmap_t *i1_2 = roaring_bitmap_and(r1, r2);
    roaring_bitmap_free(i1_2);

    // we can write a bitmap to a pointer and recover it later
    uint32_t expectedsize = roaring_bitmap_portable_size_in_bytes(r1);
    char *serializedbytes = (char *)malloc(expectedsize);
    roaring_bitmap_portable_serialize(r1, serializedbytes);
    roaring_bitmap_t *t =
        roaring_bitmap_portable_deserialize_safe(serializedbytes, expectedsize);
    if (t == NULL) {
        return EXIT_FAILURE;
    }
    const char *reason = NULL;
    if (!roaring_bitmap_internal_validate(t, &reason)) {
        return EXIT_FAILURE;
    }
    assert_true(roaring_bitmap_equals(r1, t));  // what we recover is equal
    roaring_bitmap_free(t);
    // we can also check whether there is a bitmap at a memory location without
    // reading it
    size_t sizeofbitmap =
        roaring_bitmap_portable_deserialize_size(serializedbytes, expectedsize);
    printf("\nsizeofbitmap = %zu \n", sizeofbitmap);
    assert_true(
        sizeofbitmap ==
        expectedsize);  // sizeofbitmap would be zero if no bitmap were found
    // we can also read the bitmap "safely" by specifying a byte size limit:
    t = roaring_bitmap_portable_deserialize_safe(serializedbytes, expectedsize);
    if (t == NULL) {
        printf("Problem during deserialization.\n");
        // We could clear any memory and close any file here.
        return EXIT_FAILURE;
    }
    // We can validate the bitmap we recovered to make sure it is proper.
    const char *reason_failure = NULL;
    if (!roaring_bitmap_internal_validate(t, &reason_failure)) {
        printf("safely deserialized invalid bitmap: %s\n", reason_failure);
        // We could clear any memory and close any file here.
        return EXIT_FAILURE;
    }
    assert_true(roaring_bitmap_equals(r1, t));  // what we recover is equal
    roaring_bitmap_free(t);

    free(serializedbytes);

    // we can iterate over all values using custom functions
    uint32_t counter = 0;
    roaring_iterate(r1, roaring_iterator_sumall, &counter);

    // we can also create iterator structs
    counter = 0;
    roaring_uint32_iterator_t *i = roaring_iterator_create(r1);
    while (i->has_value) {
        counter++;  // could use    i->current_value
        roaring_uint32_iterator_advance(i);
    }
    // you can skip over values and move the iterator with
    // roaring_uint32_iterator_move_equalorlarger(i,someintvalue)

    roaring_uint32_iterator_free(i);
    // roaring_bitmap_get_cardinality(r1) == counter

    // for greater speed, you can iterate over the data in bulk
    i = roaring_iterator_create(r1);
    uint32_t buffer[256];
    while (1) {
        uint32_t ret = roaring_uint32_iterator_read(i, buffer, 256);
        for (uint32_t j = 0; j < ret; j++) {
            counter += buffer[j];
        }
        if (ret < 256) {
            break;
        }
    }
    roaring_uint32_iterator_free(i);

    roaring_bitmap_free(r1);
    roaring_bitmap_free(r2);
    roaring_bitmap_free(r3);
    printf("Success.\n");
    return EXIT_SUCCESS;
}